

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_cm.c
# Opt level: O3

jas_cmxform_t *
jas_cmxform_create(jas_cmprof_t *inprof,jas_cmprof_t *outprof,jas_cmprof_t *prfprof,int op,
                  int intent,int optimize)

{
  int iVar1;
  uint uVar2;
  jas_cmxform_t *xform;
  jas_cmpxformseq_t *pxformseq;
  jas_cmpxformseq_t *othpxformseq;
  jas_cmpxformseq_t *pjVar3;
  jas_cmpxformseq_t *pjVar4;
  jas_cmpxformseq_t *local_38;
  
  xform = (jas_cmxform_t *)jas_malloc(0x10);
  if (xform != (jas_cmxform_t *)0x0) {
    pxformseq = jas_cmpxformseq_create();
    xform->pxformseq = pxformseq;
    if (pxformseq != (jas_cmpxformseq_t *)0x0) {
      switch(op) {
      case 0:
        pjVar3 = inprof->pxformseqs[intent];
        if (pjVar3 == (jas_cmpxformseq_t *)0x0) {
          pjVar3 = inprof->pxformseqs[0];
        }
        pjVar4 = outprof->pxformseqs[(long)intent + 4];
        if (pjVar4 == (jas_cmpxformseq_t *)0x0) {
          pjVar4 = outprof->pxformseqs[4];
        }
        if (((pjVar3 != (jas_cmpxformseq_t *)0x0) && (pjVar4 != (jas_cmpxformseq_t *)0x0)) &&
           (iVar1 = jas_cmpxformseq_append(pxformseq,pjVar3), iVar1 == 0)) {
          if (inprof->refclrspc != outprof->refclrspc) goto LAB_0010b30b;
          iVar1 = jas_cmpxformseq_append(xform->pxformseq,pjVar4);
          if (iVar1 == 0) {
            uVar2 = (inprof->clrspc >> 8) - 1;
            if (4 < uVar2) goto LAB_0010b30b;
            xform->numinchans = *(int *)(&DAT_001380e8 + (ulong)uVar2 * 4);
            iVar1 = outprof->clrspc;
LAB_0010b2f7:
            uVar2 = (iVar1 >> 8) - 1;
            if (uVar2 < 5) {
              xform->numoutchans = *(int *)(&DAT_001380e8 + (ulong)uVar2 * 4);
              return xform;
            }
LAB_0010b30b:
            abort();
          }
        }
        break;
      case 1:
        pjVar3 = outprof->pxformseqs[intent];
        if (pjVar3 == (jas_cmpxformseq_t *)0x0) {
          pjVar3 = outprof->pxformseqs[0];
        }
        pjVar4 = inprof->pxformseqs[(long)intent + 4];
        if (pjVar4 == (jas_cmpxformseq_t *)0x0) {
          pjVar4 = inprof->pxformseqs[4];
        }
        if (((pjVar3 != (jas_cmpxformseq_t *)0x0) && (pjVar4 != (jas_cmpxformseq_t *)0x0)) &&
           (iVar1 = jas_cmpxformseq_append(pxformseq,pjVar3), iVar1 == 0)) {
          if (outprof->refclrspc != inprof->refclrspc) goto LAB_0010b30b;
          iVar1 = jas_cmpxformseq_append(xform->pxformseq,pjVar4);
          if (iVar1 == 0) {
            uVar2 = (outprof->clrspc >> 8) - 1;
            if (4 < uVar2) goto LAB_0010b30b;
            xform->numinchans = *(int *)(&DAT_001380e8 + (ulong)uVar2 * 4);
            iVar1 = inprof->clrspc;
            goto LAB_0010b2f7;
          }
        }
        break;
      case 2:
        if (prfprof == (jas_cmprof_t *)0x0) {
          __assert_fail("prfprof",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_cm.c"
                        ,0x1a2,
                        "jas_cmxform_t *jas_cmxform_create(jas_cmprof_t *, jas_cmprof_t *, jas_cmprof_t *, int, int, int)"
                       );
        }
        pjVar3 = inprof->pxformseqs[intent];
        if (pjVar3 == (jas_cmpxformseq_t *)0x0) {
          pjVar3 = inprof->pxformseqs[0];
        }
        pjVar4 = prfprof->pxformseqs[intent];
        if (pjVar4 == (jas_cmpxformseq_t *)0x0) {
          pjVar4 = prfprof->pxformseqs[0];
        }
        if (pjVar4 != (jas_cmpxformseq_t *)0x0 && pjVar3 != (jas_cmpxformseq_t *)0x0) {
          othpxformseq = outprof->pxformseqs[(long)intent + 8];
          if ((othpxformseq == (jas_cmpxformseq_t *)0x0) &&
             (othpxformseq = outprof->pxformseqs[8], othpxformseq == (jas_cmpxformseq_t *)0x0)) {
            othpxformseq = outprof->pxformseqs[(long)intent + 4];
            if (othpxformseq == (jas_cmpxformseq_t *)0x0) {
              othpxformseq = outprof->pxformseqs[4];
            }
            local_38 = outprof->pxformseqs[intent];
            if (local_38 == (jas_cmpxformseq_t *)0x0) {
              local_38 = outprof->pxformseqs[0];
            }
            if ((othpxformseq == (jas_cmpxformseq_t *)0x0) || (local_38 == (jas_cmpxformseq_t *)0x0)
               ) break;
          }
          else {
            local_38 = (jas_cmpxformseq_t *)0x0;
          }
          iVar1 = jas_cmpxformseq_append(pxformseq,pjVar3);
          if (iVar1 == 0) {
            if (inprof->refclrspc != outprof->refclrspc) goto LAB_0010b30b;
            iVar1 = jas_cmpxformseq_append(xform->pxformseq,othpxformseq);
            if (local_38 != (jas_cmpxformseq_t *)0x0) {
              if (iVar1 != 0) break;
              iVar1 = jas_cmpxformseq_append(xform->pxformseq,local_38);
            }
            if (iVar1 == 0) {
              if (outprof->refclrspc != inprof->refclrspc) goto LAB_0010b30b;
              iVar1 = jas_cmpxformseq_append(xform->pxformseq,pjVar4);
              if (iVar1 == 0) {
                uVar2 = (inprof->clrspc >> 8) - 1;
                if (4 < uVar2) goto LAB_0010b30b;
                xform->numinchans = *(int *)(&DAT_001380e8 + (ulong)uVar2 * 4);
                iVar1 = prfprof->clrspc;
                goto LAB_0010b2f7;
              }
            }
          }
        }
        break;
      case 3:
        pjVar3 = inprof->pxformseqs[intent];
        if (pjVar3 == (jas_cmpxformseq_t *)0x0) {
          pjVar3 = inprof->pxformseqs[0];
        }
        pjVar4 = outprof->pxformseqs[0xc];
        if ((pjVar4 != (jas_cmpxformseq_t *)0x0 && pjVar3 != (jas_cmpxformseq_t *)0x0) &&
           (iVar1 = jas_cmpxformseq_append(pxformseq,pjVar3), iVar1 == 0)) {
          if (inprof->refclrspc != outprof->refclrspc) goto LAB_0010b30b;
          iVar1 = jas_cmpxformseq_append(xform->pxformseq,pjVar4);
          if (iVar1 == 0) {
            uVar2 = (inprof->clrspc >> 8) - 1;
            if (uVar2 < 5) {
              xform->numinchans = *(int *)(&DAT_001380e8 + (ulong)uVar2 * 4);
              xform->numoutchans = 1;
              return xform;
            }
            goto LAB_0010b30b;
          }
        }
        break;
      default:
        goto switchD_0010b02c_default;
      }
    }
    jas_cmxform_destroy(xform);
  }
  xform = (jas_cmxform_t *)0x0;
switchD_0010b02c_default:
  return xform;
}

Assistant:

jas_cmxform_t *jas_cmxform_create(jas_cmprof_t *inprof, jas_cmprof_t *outprof,
  jas_cmprof_t *prfprof, int op, int intent, int optimize)
{
	jas_cmxform_t *xform;
	jas_cmpxformseq_t *inpxformseq;
	jas_cmpxformseq_t *outpxformseq;
	jas_cmpxformseq_t *altoutpxformseq;
	jas_cmpxformseq_t *prfpxformseq;
	int prfintent;

	/* Avoid compiler warnings about unused parameters. */
	(void)optimize;

	prfintent = intent;

	if (!(xform = jas_malloc(sizeof(jas_cmxform_t))))
		goto error;
	if (!(xform->pxformseq = jas_cmpxformseq_create()))
		goto error;

	switch (op) {
	case JAS_CMXFORM_OP_FWD:
		inpxformseq = fwdpxformseq(inprof, intent);
		outpxformseq = revpxformseq(outprof, intent);
		if (!inpxformseq || !outpxformseq)
			goto error;
		if (jas_cmpxformseq_append(xform->pxformseq, inpxformseq) ||
		  jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  inprof->refclrspc, outprof->refclrspc) ||
		  jas_cmpxformseq_append(xform->pxformseq, outpxformseq))
			goto error;
		xform->numinchans = jas_clrspc_numchans(inprof->clrspc);
		xform->numoutchans = jas_clrspc_numchans(outprof->clrspc);
		break;
	case JAS_CMXFORM_OP_REV:
		outpxformseq = fwdpxformseq(outprof, intent);
		inpxformseq = revpxformseq(inprof, intent);
		if (!outpxformseq || !inpxformseq)
			goto error;
		if (jas_cmpxformseq_append(xform->pxformseq, outpxformseq) ||
		  jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  outprof->refclrspc, inprof->refclrspc) ||
		  jas_cmpxformseq_append(xform->pxformseq, inpxformseq))
			goto error;
		xform->numinchans = jas_clrspc_numchans(outprof->clrspc);
		xform->numoutchans = jas_clrspc_numchans(inprof->clrspc);
		break;
	case JAS_CMXFORM_OP_PROOF:
		assert(prfprof);
		inpxformseq = fwdpxformseq(inprof, intent);
		prfpxformseq = fwdpxformseq(prfprof, prfintent);
		if (!inpxformseq || !prfpxformseq)
			goto error;
		outpxformseq = simpxformseq(outprof, intent);
		altoutpxformseq = 0;
		if (!outpxformseq) {
			outpxformseq = revpxformseq(outprof, intent);
			altoutpxformseq = fwdpxformseq(outprof, intent);
			if (!outpxformseq || !altoutpxformseq)
				goto error;
		}
		if (jas_cmpxformseq_append(xform->pxformseq, inpxformseq) ||
		  jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  inprof->refclrspc, outprof->refclrspc))
			goto error;
		if (altoutpxformseq) {
			if (jas_cmpxformseq_append(xform->pxformseq, outpxformseq) ||
			  jas_cmpxformseq_append(xform->pxformseq, altoutpxformseq))
				goto error;
		} else {
			if (jas_cmpxformseq_append(xform->pxformseq, outpxformseq))
				goto error;
		}
		if (jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  outprof->refclrspc, inprof->refclrspc) ||
		  jas_cmpxformseq_append(xform->pxformseq, prfpxformseq))
			goto error;
		xform->numinchans = jas_clrspc_numchans(inprof->clrspc);
		xform->numoutchans = jas_clrspc_numchans(prfprof->clrspc);
		break;
	case JAS_CMXFORM_OP_GAMUT:
		inpxformseq = fwdpxformseq(inprof, intent);
		outpxformseq = gampxformseq(outprof);
		if (!inpxformseq || !outpxformseq)
			goto error;
		if (jas_cmpxformseq_append(xform->pxformseq, inpxformseq) ||
		  jas_cmpxformseq_appendcnvt(xform->pxformseq,
		  inprof->refclrspc, outprof->refclrspc) ||
		  jas_cmpxformseq_append(xform->pxformseq, outpxformseq))
			goto error;
		xform->numinchans = jas_clrspc_numchans(inprof->clrspc);
		xform->numoutchans = 1;
		break;
	}
	return xform;
error:
	if (xform)
		jas_cmxform_destroy(xform);
	return 0;
}